

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int nodeAcquire(Rtree *pRtree,i64 iNode,RtreeNode *pParent,RtreeNode **ppNode)

{
  sqlite3_blob **ppBlob;
  ulong uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  RtreeNode *p;
  sqlite3_blob *pBlob;
  sqlite3_blob *pBlob_00;
  
  p = nodeHashLookup(pRtree,iNode);
  if (p != (RtreeNode *)0x0) {
    if ((pParent != (RtreeNode *)0x0) && (p->pParent != pParent)) {
      return 0x10b;
    }
    p->nRef = p->nRef + 1;
    iVar4 = 0;
    goto LAB_001dae91;
  }
  ppBlob = &pRtree->pNodeBlob;
  pBlob_00 = pRtree->pNodeBlob;
  if (pBlob_00 == (sqlite3_blob *)0x0) {
LAB_001dad1a:
    iVar4 = 0;
    iVar3 = sqlite3_blob_open(pRtree->db,pRtree->zDb,pRtree->zNodeName,"data",iNode,0,ppBlob);
    if (iVar3 != 0) goto LAB_001dad44;
    pBlob_00 = pRtree->pNodeBlob;
    iVar3 = pRtree->iNodeSize;
    if (pBlob_00 != (sqlite3_blob *)0x0) goto LAB_001dad67;
LAB_001dad77:
    if (iVar3 != iVar4) {
      iVar4 = 0;
      goto LAB_001dadcf;
    }
    p = (RtreeNode *)sqlite3_malloc64((long)iVar3 + 0x28);
    if (p == (RtreeNode *)0x0) {
      iVar4 = 7;
      goto LAB_001dadcf;
    }
    p->pParent = pParent;
    p->zData = (u8 *)(p + 1);
    p->nRef = 1;
    pRtree->nNodeRef = pRtree->nNodeRef + 1;
    p->iNode = iNode;
    p->isDirty = 0;
    p->pNext = (RtreeNode *)0x0;
    iVar4 = sqlite3_blob_read(pRtree->pNodeBlob,p + 1,pRtree->iNodeSize,0);
  }
  else {
    *ppBlob = (sqlite3_blob *)0x0;
    iVar3 = sqlite3_blob_reopen(pBlob_00,iNode);
    *ppBlob = pBlob_00;
    if (iVar3 == 0) {
      iVar3 = pRtree->iNodeSize;
LAB_001dad67:
      if (*(long *)(pBlob_00 + 0x18) == 0) {
        iVar4 = 0;
      }
      else {
        iVar4 = *(int *)pBlob_00;
      }
      goto LAB_001dad77;
    }
    nodeBlobReset(pRtree);
    if (iVar3 == 7) {
      return 7;
    }
    if (*ppBlob == (sqlite3_blob *)0x0) goto LAB_001dad1a;
LAB_001dad44:
    *ppNode = (RtreeNode *)0x0;
    iVar4 = 0x10b;
    if (iVar3 != 1) {
      iVar4 = iVar3;
    }
LAB_001dadcf:
    p = (RtreeNode *)0x0;
  }
  if (((iNode == 1) && (iVar4 == 0)) && (p != (RtreeNode *)0x0)) {
    uVar2 = *(ushort *)p->zData << 8 | *(ushort *)p->zData >> 8;
    pRtree->iDepth = (uint)uVar2;
    iVar4 = 0x10b;
    if (uVar2 < 0x29) {
      iVar4 = 0;
    }
  }
  if ((p == (RtreeNode *)0x0) || (iVar4 != 0)) {
    if (iVar4 != 0) goto LAB_001dae42;
    if (p != (RtreeNode *)0x0) goto LAB_001dae65;
    iVar4 = 0x10b;
  }
  else {
    iVar4 = 0x10b;
    if ((int)(uint)(ushort)(*(ushort *)(p->zData + 2) << 8 | *(ushort *)(p->zData + 2) >> 8) <=
        (pRtree->iNodeSize + -4) / (int)(uint)pRtree->nBytesPerCell) {
LAB_001dae65:
      if (pParent != (RtreeNode *)0x0) {
        pParent->nRef = pParent->nRef + 1;
      }
      iVar4 = 0;
      uVar1 = (ulong)(uint)p->iNode % 0x61;
      p->pNext = pRtree->aHash[uVar1];
      pRtree->aHash[uVar1] = p;
      goto LAB_001dae91;
    }
LAB_001dae42:
    nodeBlobReset(pRtree);
    if (p != (RtreeNode *)0x0) {
      pRtree->nNodeRef = pRtree->nNodeRef - 1;
      sqlite3_free(p);
    }
  }
  p = (RtreeNode *)0x0;
LAB_001dae91:
  *ppNode = p;
  return iVar4;
}

Assistant:

static int nodeAcquire(
  Rtree *pRtree,             /* R-tree structure */
  i64 iNode,                 /* Node number to load */
  RtreeNode *pParent,        /* Either the parent node or NULL */
  RtreeNode **ppNode         /* OUT: Acquired node */
){
  int rc = SQLITE_OK;
  RtreeNode *pNode = 0;

  /* Check if the requested node is already in the hash table. If so,
  ** increase its reference count and return it.
  */
  if( (pNode = nodeHashLookup(pRtree, iNode))!=0 ){
    if( pParent && ALWAYS(pParent!=pNode->pParent) ){
      RTREE_IS_CORRUPT(pRtree);
      return SQLITE_CORRUPT_VTAB;
    }
    pNode->nRef++;
    *ppNode = pNode;
    return SQLITE_OK;
  }

  if( pRtree->pNodeBlob ){
    sqlite3_blob *pBlob = pRtree->pNodeBlob;
    pRtree->pNodeBlob = 0;
    rc = sqlite3_blob_reopen(pBlob, iNode);
    pRtree->pNodeBlob = pBlob;
    if( rc ){
      nodeBlobReset(pRtree);
      if( rc==SQLITE_NOMEM ) return SQLITE_NOMEM;
    }
  }
  if( pRtree->pNodeBlob==0 ){
    rc = sqlite3_blob_open(pRtree->db, pRtree->zDb, pRtree->zNodeName,
                           "data", iNode, 0,
                           &pRtree->pNodeBlob);
  }
  if( rc ){
    *ppNode = 0;
    /* If unable to open an sqlite3_blob on the desired row, that can only
    ** be because the shadow tables hold erroneous data. */
    if( rc==SQLITE_ERROR ){
      rc = SQLITE_CORRUPT_VTAB;
      RTREE_IS_CORRUPT(pRtree);
    }
  }else if( pRtree->iNodeSize==sqlite3_blob_bytes(pRtree->pNodeBlob) ){
    pNode = (RtreeNode *)sqlite3_malloc64(sizeof(RtreeNode)+pRtree->iNodeSize);
    if( !pNode ){
      rc = SQLITE_NOMEM;
    }else{
      pNode->pParent = pParent;
      pNode->zData = (u8 *)&pNode[1];
      pNode->nRef = 1;
      pRtree->nNodeRef++;
      pNode->iNode = iNode;
      pNode->isDirty = 0;
      pNode->pNext = 0;
      rc = sqlite3_blob_read(pRtree->pNodeBlob, pNode->zData,
                             pRtree->iNodeSize, 0);
    }
  }

  /* If the root node was just loaded, set pRtree->iDepth to the height
  ** of the r-tree structure. A height of zero means all data is stored on
  ** the root node. A height of one means the children of the root node
  ** are the leaves, and so on. If the depth as specified on the root node
  ** is greater than RTREE_MAX_DEPTH, the r-tree structure must be corrupt.
  */
  if( rc==SQLITE_OK && pNode && iNode==1 ){
    pRtree->iDepth = readInt16(pNode->zData);
    if( pRtree->iDepth>RTREE_MAX_DEPTH ){
      rc = SQLITE_CORRUPT_VTAB;
      RTREE_IS_CORRUPT(pRtree);
    }
  }

  /* If no error has occurred so far, check if the "number of entries"
  ** field on the node is too large. If so, set the return code to
  ** SQLITE_CORRUPT_VTAB.
  */
  if( pNode && rc==SQLITE_OK ){
    if( NCELL(pNode)>((pRtree->iNodeSize-4)/pRtree->nBytesPerCell) ){
      rc = SQLITE_CORRUPT_VTAB;
      RTREE_IS_CORRUPT(pRtree);
    }
  }

  if( rc==SQLITE_OK ){
    if( pNode!=0 ){
      nodeReference(pParent);
      nodeHashInsert(pRtree, pNode);
    }else{
      rc = SQLITE_CORRUPT_VTAB;
      RTREE_IS_CORRUPT(pRtree);
    }
    *ppNode = pNode;
  }else{
    nodeBlobReset(pRtree);
    if( pNode ){
      pRtree->nNodeRef--;
      sqlite3_free(pNode);
    }
    *ppNode = 0;
  }

  return rc;
}